

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::ValidateSymbolName
          (DescriptorBuilder *this,string *name,string *full_name,Message *proto)

{
  byte bVar1;
  long *plVar2;
  ulong uVar3;
  size_type *psVar4;
  ulong uVar5;
  string local_78;
  Message *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar3 = name->_M_string_length;
  local_58 = proto;
  if (uVar3 == 0) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Missing name.","");
    AddError(this,full_name,local_58,NAME,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    uVar5 = 0;
    do {
      bVar1 = (name->_M_dataplus)._M_p[uVar5];
      if ((char)bVar1 < 'a') {
        if ((char)bVar1 < 'A') {
          if ((byte)(bVar1 - 0x3a) < 0xf6) {
LAB_001d3447:
            std::operator+(&local_50,"\"",name);
            plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
            psVar4 = (size_type *)(plVar2 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar2 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar4) {
              local_78.field_2._M_allocated_capacity = *psVar4;
              local_78.field_2._8_8_ = plVar2[3];
              local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            }
            else {
              local_78.field_2._M_allocated_capacity = *psVar4;
              local_78._M_dataplus._M_p = (pointer)*plVar2;
            }
            local_78._M_string_length = plVar2[1];
            *plVar2 = (long)psVar4;
            plVar2[1] = 0;
            *(undefined1 *)(plVar2 + 2) = 0;
            AddError(this,full_name,local_58,NAME,&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            uVar3 = name->_M_string_length;
          }
        }
        else if (bVar1 != 0x5f && 0x5a < bVar1) goto LAB_001d3447;
      }
      else if (0x7a < bVar1) goto LAB_001d3447;
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar3);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateSymbolName(
    const string& name, const string& full_name, const Message& proto) {
  if (name.empty()) {
    AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
             "Missing name.");
  } else {
    for (int i = 0; i < name.size(); i++) {
      // I don't trust isalnum() due to locales.  :(
      if ((name[i] < 'a' || 'z' < name[i]) &&
          (name[i] < 'A' || 'Z' < name[i]) &&
          (name[i] < '0' || '9' < name[i]) &&
          (name[i] != '_')) {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
                 "\"" + name + "\" is not a valid identifier.");
      }
    }
  }
}